

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifDec16.c
# Opt level: O3

int If_CluMinimumBase(word *t,int *pSupp,int nVarsAll,int *pnVars)

{
  uint uVar1;
  int iVar2;
  ulong uVar3;
  byte bVar4;
  int iVar5;
  uint iVar;
  ulong uVar6;
  uint uVar7;
  uint uVar8;
  int iVar9;
  ulong uVar10;
  word *pwVar11;
  word *pwVar12;
  word local_2038 [1025];
  
  if (0x10 < nVarsAll) {
    __assert_fail("nVarsAll <= 16",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifDec16.c"
                  ,0x5ff,"int If_CluMinimumBase(word *, int *, int, int *)");
  }
  if (0 < nVarsAll) {
    uVar1 = 1 << ((char)nVarsAll - 6U & 0x1f);
    if ((uint)nVarsAll < 7) {
      uVar1 = 1;
    }
    uVar6 = 0;
    uVar8 = 0;
    iVar2 = 0;
LAB_00419421:
    if (uVar6 < 6) {
      uVar7 = 1 << ((byte)uVar6 & 0x1f);
      uVar10 = 0;
      do {
        if ((t[uVar10] & ~Truth6[uVar6]) != (t[uVar10] & Truth6[uVar6]) >> ((byte)uVar7 & 0x3f))
        goto LAB_004194fb;
        uVar10 = uVar10 + 1;
      } while (uVar1 != uVar10);
    }
    else {
      bVar4 = (byte)(uVar6 - 6);
      uVar7 = 1 << (bVar4 & 0x1f);
      iVar9 = 2 << (bVar4 & 0x1f);
      uVar10 = 1;
      if (1 < (int)uVar7) {
        uVar10 = (ulong)uVar7;
      }
      pwVar11 = t + (int)uVar7;
      iVar5 = 0;
      pwVar12 = t;
      do {
        if (uVar6 - 6 != 0x1f) {
          uVar3 = 0;
          do {
            if (pwVar12[uVar3] != pwVar11[uVar3]) {
              uVar7 = 1 << ((byte)uVar6 & 0x1f);
              goto LAB_004194fb;
            }
            uVar3 = uVar3 + 1;
          } while (uVar10 != uVar3);
        }
        iVar5 = iVar5 + iVar9;
        pwVar11 = pwVar11 + iVar9;
        pwVar12 = pwVar12 + iVar9;
      } while (iVar5 < (int)uVar1);
    }
    goto LAB_0041950f;
  }
  iVar2 = 0;
  uVar8 = 0;
LAB_00419523:
  if (pnVars != (int *)0x0) {
    *pnVars = iVar2;
  }
  if ((uVar8 + 1 & uVar8) == 0) {
    iVar2 = 0;
  }
  else {
    if (nVarsAll < 1) {
      if (iVar2 != 0) goto LAB_00419621;
    }
    else {
      pwVar11 = local_2038;
      uVar1 = 0;
      iVar9 = 0;
      uVar7 = 0;
      do {
        if ((uVar8 >> (uVar7 & 0x1f) & 1) != 0) {
          pwVar12 = t;
          iVar = uVar7;
          if (iVar9 < (int)uVar7) {
            do {
              t = pwVar11;
              pwVar11 = pwVar12;
              iVar = iVar - 1;
              If_CluSwapAdjacent(t,pwVar11,iVar,nVarsAll);
              pwVar12 = t;
            } while (iVar9 < (int)iVar);
            uVar1 = (uVar1 - iVar9) + uVar7;
          }
          iVar9 = iVar9 + 1;
        }
        uVar7 = uVar7 + 1;
      } while (uVar7 != nVarsAll);
      if (iVar9 != iVar2) {
LAB_00419621:
        __assert_fail("Var == nVars",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifDec16.c"
                      ,0x5f7,"void If_CluTruthShrink(word *, int, int, unsigned int)");
      }
      if ((uVar1 & 1) != 0) {
        uVar1 = 1 << ((char)nVarsAll - 6U & 0x1f);
        if (nVarsAll < 7) {
          uVar1 = 1;
        }
        if (0 < (int)uVar1) {
          memcpy(pwVar11,t,(ulong)uVar1 << 3);
        }
      }
    }
    iVar2 = 1;
  }
  return iVar2;
LAB_004194fb:
  if (pSupp != (int *)0x0) {
    pSupp[iVar2] = pSupp[uVar6];
  }
  uVar8 = uVar8 | uVar7;
  iVar2 = iVar2 + 1;
LAB_0041950f:
  uVar6 = uVar6 + 1;
  if (uVar6 == (uint)nVarsAll) goto LAB_00419523;
  goto LAB_00419421;
}

Assistant:

int If_CluMinimumBase( word * t, int * pSupp, int nVarsAll, int * pnVars )
{
    int v, iVar = 0, uSupp = 0;
    assert( nVarsAll <= 16 );
    for ( v = 0; v < nVarsAll; v++ )
        if ( If_CluHasVar( t, nVarsAll, v ) )
        {
            uSupp |= (1 << v);
            if ( pSupp )
                pSupp[iVar] = pSupp[v];
            iVar++;
        }
    if ( pnVars )
        *pnVars = iVar;
    if ( If_CluSuppIsMinBase( uSupp ) )
        return 0;
    If_CluTruthShrink( t, iVar, nVarsAll, uSupp );
    return 1;
}